

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BvhNode.cpp
# Opt level: O0

void __thiscall
BVH_Node::BVH_Node(BVH_Node *this,Object **list,int size,float t_start,float t_end,bool is_root)

{
  byte bVar1;
  _func_int **pp_Var2;
  undefined1 in_CL;
  int in_EDX;
  BVH_Node *in_RSI;
  Object *in_RDI;
  undefined4 in_XMM0_Da;
  int in_XMM1_Da;
  AABB _aabb_right;
  AABB _aabb_left;
  int _div_size_2;
  AABB *in_stack_000000e0;
  AABB *in_stack_000000e8;
  undefined6 in_stack_ffffffffffffff60;
  byte in_stack_ffffffffffffff66;
  AABB *in_stack_ffffffffffffff70;
  _func_int **local_78;
  _func_int **local_70;
  _func_int **local_68;
  undefined1 local_60 [24];
  undefined1 local_48 [24];
  int local_30;
  undefined1 in_stack_ffffffffffffffdb;
  float in_stack_ffffffffffffffdc;
  undefined3 in_stack_ffffffffffffffe0;
  float t_start_00;
  
  t_start_00 = (float)(CONCAT13(in_CL,in_stack_ffffffffffffffe0) & 0x1ffffff);
  Object::Object(in_RDI);
  in_RDI->_vptr_Object = (_func_int **)&PTR__BVH_Node_0012e9a8;
  AABB::AABB(in_stack_ffffffffffffff70);
  *(byte *)((long)&in_RDI[6]._vptr_Object + 1) = (byte)((uint)t_start_00 >> 0x18) & 1;
  if (in_EDX == 1) {
    pp_Var2 = (in_RSI->super_Object)._vptr_Object;
    in_RDI[5]._vptr_Object = pp_Var2;
    in_RDI[4]._vptr_Object = pp_Var2;
    *(undefined1 *)&in_RDI[6]._vptr_Object = 1;
  }
  else if (in_EDX == 2) {
    in_RDI[4]._vptr_Object = (in_RSI->super_Object)._vptr_Object;
    in_RDI[5]._vptr_Object = *(_func_int ***)(in_RSI->m_aabb).m_min.e;
    *(undefined1 *)&in_RDI[6]._vptr_Object = 1;
  }
  else {
    local_30 = in_EDX / 2;
    in_stack_ffffffffffffff70 = (AABB *)operator_new(0x38);
    BVH_Node(in_RSI,(Object **)CONCAT44(in_EDX,in_XMM0_Da),in_XMM1_Da,t_start_00,
             in_stack_ffffffffffffffdc,(bool)in_stack_ffffffffffffffdb);
    in_RDI[4]._vptr_Object = (_func_int **)in_stack_ffffffffffffff70;
    pp_Var2 = (_func_int **)operator_new(0x38);
    BVH_Node(in_RSI,(Object **)CONCAT44(in_EDX,in_XMM0_Da),in_XMM1_Da,t_start_00,
             in_stack_ffffffffffffffdc,(bool)in_stack_ffffffffffffffdb);
    in_RDI[5]._vptr_Object = pp_Var2;
    *(undefined1 *)&in_RDI[6]._vptr_Object = 0;
  }
  AABB::AABB(in_stack_ffffffffffffff70);
  AABB::AABB(in_stack_ffffffffffffff70);
  bVar1 = (**(code **)(*in_RDI[4]._vptr_Object + 0x18))
                    (in_XMM0_Da,in_XMM1_Da,in_RDI[4]._vptr_Object,local_48);
  if (((bVar1 & 1) == 0) ||
     (in_stack_ffffffffffffff66 =
           (**(code **)(*in_RDI[5]._vptr_Object + 0x18))
                     (in_XMM0_Da,in_XMM1_Da,in_RDI[5]._vptr_Object,local_60),
     (in_stack_ffffffffffffff66 & 1) == 0)) {
    std::operator<<((ostream *)&std::cerr,"Bounding Box Creation Error\n");
  }
  AABB::Merge(in_stack_000000e8,in_stack_000000e0);
  in_RDI[1]._vptr_Object = local_78;
  in_RDI[2]._vptr_Object = local_70;
  in_RDI[3]._vptr_Object = local_68;
  AABB::~AABB((AABB *)CONCAT17(bVar1,CONCAT16(in_stack_ffffffffffffff66,in_stack_ffffffffffffff60)))
  ;
  AABB::~AABB((AABB *)CONCAT17(bVar1,CONCAT16(in_stack_ffffffffffffff66,in_stack_ffffffffffffff60)))
  ;
  AABB::~AABB((AABB *)CONCAT17(bVar1,CONCAT16(in_stack_ffffffffffffff66,in_stack_ffffffffffffff60)))
  ;
  return;
}

Assistant:

BVH_Node::BVH_Node(Object **list, int size, float t_start, float t_end, bool is_root)
{
    m_is_root = is_root;

    if(size == 1) {
        m_node_left = m_node_right = list[0];
        m_is_leaf   = true;
    } 
    else if(size == 2) {
        m_node_left  = list[0];
        m_node_right = list[1];
        m_is_leaf    = true;
    }
    else {
        int _div_size_2 = size/2;
        m_node_left  = new BVH_Node(list              ,        _div_size_2, t_start, t_end);
        m_node_right = new BVH_Node(list + _div_size_2, size - _div_size_2, t_start, t_end);
        m_is_leaf    = false;
    }

    AABB _aabb_left, _aabb_right;
    if(!m_node_left->CreateBoundingBox (t_start, t_end, _aabb_left ) ||
       !m_node_right->CreateBoundingBox(t_start, t_end, _aabb_right)) {
           std::cerr << "Bounding Box Creation Error\n";
    }

    m_aabb = AABB::Merge(_aabb_left, _aabb_right);
}